

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::handlePackOffset
          (HlslParseContext *this,TSourceLoc *loc,TQualifier *qualifier,TString *location,
          TString *component)

{
  TString *this_00;
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  char *__nptr;
  int local_5c;
  undefined1 local_58 [4];
  int componentOffset;
  TString *local_30;
  TString *component_local;
  TString *location_local;
  TQualifier *qualifier_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  local_30 = component;
  component_local = location;
  location_local = (TString *)qualifier;
  qualifier_local = (TQualifier *)loc;
  loc_local = (TSourceLoc *)this;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          size(location);
  if ((sVar2 == 0) ||
     (pvVar3 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
               operator[](component_local,0), *pvVar3 != 'c')) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,qualifier_local,"expected \'c\'","packoffset","");
  }
  else {
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::size(component_local);
    if (sVar2 != 1) {
      pvVar3 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
               operator[](component_local,1);
      iVar1 = isdigit((int)*pvVar3);
      this_00 = component_local;
      if (iVar1 == 0) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,qualifier_local,"expected number after \'c\'","packoffset","");
      }
      else {
        sVar2 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::size
                          (component_local);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        substr((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               local_58,this_00,1,sVar2);
        __nptr = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)local_58);
        iVar1 = atoi(__nptr);
        *(int *)((long)&location_local->_M_string_length + 4) = iVar1 << 4;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      local_58);
        if (local_30 !=
            (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)0x0) {
          pvVar3 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                   operator[](local_30,0);
          switch(*pvVar3) {
          case 'w':
            local_5c = 0xc;
            break;
          case 'x':
            local_5c = 0;
            break;
          case 'y':
            local_5c = 4;
            break;
          case 'z':
            local_5c = 8;
            break;
          default:
            local_5c = -1;
          }
          if ((local_5c < 0) ||
             (sVar2 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      size(local_30), 1 < sVar2)) {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,qualifier_local,"expected {x, y, z, w} for component","packoffset","");
          }
          else {
            *(int *)((long)&location_local->_M_string_length + 4) =
                 local_5c + *(int *)((long)&location_local->_M_string_length + 4);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void HlslParseContext::handlePackOffset(const TSourceLoc& loc, TQualifier& qualifier, const glslang::TString& location,
                                        const glslang::TString* component)
{
    if (location.size() == 0 || location[0] != 'c') {
        error(loc, "expected 'c'", "packoffset", "");
        return;
    }
    if (location.size() == 1)
        return;
    if (! isdigit(location[1])) {
        error(loc, "expected number after 'c'", "packoffset", "");
        return;
    }

    qualifier.layoutOffset = 16 * atoi(location.substr(1, location.size()).c_str());
    if (component != nullptr) {
        int componentOffset = 0;
        switch ((*component)[0]) {
        case 'x': componentOffset =  0; break;
        case 'y': componentOffset =  4; break;
        case 'z': componentOffset =  8; break;
        case 'w': componentOffset = 12; break;
        default:
            componentOffset = -1;
            break;
        }
        if (componentOffset < 0 || component->size() > 1) {
            error(loc, "expected {x, y, z, w} for component", "packoffset", "");
            return;
        }
        qualifier.layoutOffset += componentOffset;
    }
}